

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_SetSelectBest(Kf_Set_t *p,int fArea,int fSort)

{
  int iVar1;
  int local_28;
  uint local_24;
  int nCuts;
  int i;
  Kf_Cut_t *pCut;
  int fSort_local;
  int fArea_local;
  Kf_Set_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; (int)local_24 <= (int)(uint)p->nLutSize; local_24 = local_24 + 1) {
    for (_nCuts = Kf_SetCut(p,p->pList[(int)local_24]); _nCuts != (Kf_Cut_t *)0x0;
        _nCuts = Kf_SetCut(p,_nCuts->iNext)) {
      local_28 = Kf_SetStoreAddOne(p,local_28,p->nCutNum - 1,_nCuts,fArea);
    }
  }
  if ((0 < local_28) && (local_28 < (int)(uint)p->nCutNum)) {
    p->nCuts = local_28;
    p->pCutBest = p->ppCuts[0];
    if (fSort != 0) {
      for (local_24 = 0; (int)local_24 <= (int)(uint)p->nLutSize; local_24 = local_24 + 1) {
        p->pList[(int)local_24] = -1;
      }
      for (local_24 = 0; (int)local_24 < local_28; local_24 = local_24 + 1) {
        Kf_SetAddToList(p,p->ppCuts[(int)local_24],0);
      }
      p->nCuts = 0;
      for (local_24 = (uint)p->nLutSize; -1 < (int)local_24; local_24 = local_24 - 1) {
        for (_nCuts = Kf_SetCut(p,p->pList[(int)local_24]); _nCuts != (Kf_Cut_t *)0x0;
            _nCuts = Kf_SetCut(p,_nCuts->iNext)) {
          iVar1 = p->nCuts;
          p->nCuts = iVar1 + 1;
          p->ppCuts[iVar1] = _nCuts;
        }
      }
      if (p->nCuts != local_28) {
        __assert_fail("p->nCuts == nCuts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x132,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
      }
    }
    return;
  }
  __assert_fail("nCuts > 0 && nCuts < p->nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                ,0x124,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
}

Assistant:

static inline void Kf_SetSelectBest( Kf_Set_t * p, int fArea, int fSort )
{
//    int fArea = p->pMan->pPars->fArea;
    Kf_Cut_t * pCut;
    int i, nCuts = 0;
    for ( i = 0; i <= p->nLutSize; i++ )
        Kf_ListForEachCut( p, i, pCut )
            nCuts = Kf_SetStoreAddOne( p, nCuts, p->nCutNum-1, pCut, fArea );
    assert( nCuts > 0 && nCuts < p->nCutNum );
    p->nCuts = nCuts;
    p->pCutBest = p->ppCuts[0];
    if ( !fSort )
        return;
    // sort by size in the reverse order
    for ( i = 0; i <= p->nLutSize; i++ )
        p->pList[i] = -1;
    for ( i = 0; i < nCuts; i++ )
        Kf_SetAddToList( p, p->ppCuts[i], 0 );
    p->nCuts = 0;
    for ( i = p->nLutSize; i >= 0; i-- )
        Kf_ListForEachCut( p, i, pCut )
            p->ppCuts[p->nCuts++] = pCut;
    assert( p->nCuts == nCuts );
}